

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<soul::CodeLocation,_4UL>::clear
          (ArrayWithPreallocation<soul::CodeLocation,_4UL> *this)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < this->numActive; uVar2 = uVar2 + 1) {
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)
               ((long)&(this->items->sourceCode).object + lVar1));
    lVar1 = lVar1 + 0x10;
  }
  this->numActive = 0;
  freeIfHeapAllocated(this);
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }